

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SamSequence.cpp
# Opt level: O0

void __thiscall BamTools::SamSequence::Clear(SamSequence *this)

{
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::__cxx11::string::clear();
  std::vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_>::clear
            ((vector<BamTools::CustomHeaderTag,_std::allocator<BamTools::CustomHeaderTag>_> *)
             0x208db5);
  return;
}

Assistant:

void SamSequence::Clear()
{
    AssemblyID.clear();
    Checksum.clear();
    Length.clear();
    Name.clear();
    Species.clear();
    URI.clear();
    CustomTags.clear();
}